

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_node.hpp
# Opt level: O1

bool jsoncons::jsonpath::operator<(basic_path_node<wchar_t> *lhs,basic_path_node<wchar_t> *rhs)

{
  path_node_kind pVar1;
  ulong uVar2;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> __str;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  
  uVar2 = lhs->size_;
  uVar3 = uVar2;
  while (rhs->size_ < uVar2) {
    lhs = lhs->parent_;
    uVar3 = rhs->size_;
    uVar2 = lhs->size_;
  }
  if (uVar3 < rhs->size_) {
    do {
      rhs = rhs->parent_;
    } while (uVar3 < rhs->size_);
    bVar5 = true;
    bVar6 = true;
  }
  else {
    bVar5 = false;
    bVar6 = false;
  }
  if (lhs != (basic_path_node<wchar_t> *)0x0) {
    bVar6 = bVar5;
    do {
      pVar1 = lhs->node_kind_;
      iVar4 = pVar1 - rhs->node_kind_;
      if (iVar4 == 0) {
        iVar4 = 0;
        if (pVar1 < index) {
          __str._M_len = (rhs->name_)._M_len;
          __str._M_str = (rhs->name_)._M_str;
          iVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::compare
                            (&lhs->name_,__str);
        }
        else if (pVar1 == index) {
          iVar4 = (int)lhs->index_ - (int)rhs->index_;
        }
      }
      if (iVar4 != 0) {
        bVar6 = false;
      }
      if (iVar4 < 0) {
        bVar6 = true;
      }
      lhs = lhs->parent_;
      rhs = rhs->parent_;
    } while (lhs != (basic_path_node<wchar_t> *)0x0);
  }
  return bVar6;
}

Assistant:

bool operator<(const basic_path_node& lhs, const basic_path_node& rhs)
        {
            std::size_t len = (std::min)(lhs.size(),rhs.size());

            const basic_path_node* p_lhs = std::addressof(lhs);
            const basic_path_node* p_rhs = std::addressof(rhs);

            bool is_less = false;
            while (p_lhs->size() > len)
            {
                p_lhs = p_lhs->parent_;
                is_less = false;
            }
            while (p_rhs->size() > len)
            {
                p_rhs = p_rhs->parent_;
                is_less = true;
            }
            while (p_lhs != nullptr)
            {
                int diff = 0;
                if (p_lhs->node_kind_ != p_rhs->node_kind_)
                {
                    diff = static_cast<int>(p_lhs->node_kind_) - static_cast<int>(p_rhs->node_kind_);
                }
                else
                {
                    switch (p_lhs->node_kind_)
                    {
                        case path_node_kind::root:
                        case path_node_kind::name:
                            diff = p_lhs->name_.compare(p_rhs->name_);
                            break;
                        case path_node_kind::index:
                            diff = static_cast<int>(p_lhs->index_) - static_cast<int>(p_rhs->index_);
                            break;
                        default:
                            break;
                    }
                }
                if (diff < 0)
                {
                    is_less = true;
                }
                else if (diff > 0)
                {
                    is_less = false;
                }

                p_lhs = p_lhs->parent_;
                p_rhs = p_rhs->parent_;
            }

            return is_less;
        }